

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_util.c
# Opt level: O1

char * cmime_util_get_mimetype(char *filename)

{
  FILE *__stream;
  __ssize_t _Var1;
  size_t sVar2;
  char *__dest;
  char *pcVar3;
  size_t local_38;
  size_t st;
  char *command;
  char *buf;
  
  command = (char *)0x0;
  local_38 = 0;
  st = 0;
  if (filename != (char *)0x0) {
    __dest = (char *)0x0;
    asprintf((char **)&st,"%s \'%s\'","/usr/bin/file -b --mime",filename);
    __stream = popen((char *)st,"r");
    free((void *)st);
    if (__stream != (FILE *)0x0) {
      _Var1 = getline(&command,&local_38,__stream);
      pcVar3 = command;
      if (_Var1 < 1) {
        __dest = (char *)0x0;
      }
      else {
        sVar2 = strlen(command);
        __dest = (char *)calloc(sVar2 + 1,1);
        pcVar3 = cmime_string_chomp(pcVar3);
        command = pcVar3;
        sVar2 = strlen(pcVar3);
        strncpy(__dest,pcVar3,sVar2);
        sVar2 = strlen(__dest);
        __dest[sVar2] = '\0';
        free(pcVar3);
      }
      pclose(__stream);
    }
    return __dest;
  }
  __assert_fail("filename",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_util.c"
                ,0x3d,"char *cmime_util_get_mimetype(const char *)");
}

Assistant:

char *cmime_util_get_mimetype(const char *filename) {
    char *buf = NULL;
    size_t st = 0;
    FILE *fh = NULL;
    char *command = NULL;
    char *retval = NULL;
    
    assert(filename);
    
    /* build up the command string */
    asprintf(&command,"%s '%s'",FILE_EXECUTABLE,filename);

    /* open the pipe and try to read command output */
    fh = popen(command, "r");
    if(fh == NULL) {
        free(command);
        return(NULL);
    }
    free(command);
    if(getline(&buf,&st,fh) > 0) {
        /* copy command output from static buffer into string */
        retval =  (char *)calloc(strlen(buf) + sizeof(char), sizeof(char));
        buf = cmime_string_chomp(buf);
        strncpy(retval, buf, strlen(buf));
        retval[strlen(retval)] = '\0';
        free(buf);
        pclose(fh);
        return(retval);
    } else {
        pclose(fh);
        return(NULL);
    }
}